

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall fmt::v8::format_int::format_signed<int>(format_int *this,int value)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_or_64_or_128_t<int> abs_value;
  
  uVar4 = (ulong)(uint)-value;
  if (0 < value) {
    uVar4 = (ulong)(uint)value;
  }
  pcVar1 = this->buffer_ + 0x15;
  uVar2 = (uint)uVar4;
  if (99 < uVar2) {
    do {
      uVar3 = (uint)uVar4;
      uVar2 = (uint)(uVar4 / 100);
      uVar4 = uVar4 / 100;
      *(undefined2 *)(pcVar1 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(uVar3 + (int)uVar4 * -100) * 2);
      pcVar1 = pcVar1 + -2;
    } while (9999 < uVar3);
  }
  if (uVar2 < 10) {
    pcVar1[-1] = (byte)uVar2 | 0x30;
    pcVar1 = pcVar1 + -1;
  }
  else {
    *(undefined2 *)(pcVar1 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (ulong)uVar2 * 2);
    pcVar1 = pcVar1 + -2;
  }
  if (value < 0) {
    pcVar1[-1] = '-';
    return pcVar1 + -1;
  }
  return pcVar1;
}

Assistant:

auto format_signed(Int value) -> char* {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }